

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_TestEmptyFileSets::_Run(_Test_TestEmptyFileSets *this)

{
  bool bVar1;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *compaction_files;
  Tester local_360;
  Tester local_1b0;
  _Test_TestEmptyFileSets *local_10;
  _Test_TestEmptyFileSets *this_local;
  
  compaction_files = &(this->super_AddBoundaryInputsTest).compaction_files_;
  local_10 = this;
  AddBoundaryInputs(&(this->super_AddBoundaryInputsTest).icmp_,
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    this,compaction_files);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0xd1);
  bVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    (compaction_files);
  test::Tester::Is(&local_1b0,bVar1,"compaction_files_.empty()");
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_360,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0xd2);
  bVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     this);
  test::Tester::Is(&local_360,bVar1,"level_files_.empty()");
  test::Tester::~Tester(&local_360);
  return;
}

Assistant:

TEST(AddBoundaryInputsTest, TestEmptyFileSets) {
  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_TRUE(compaction_files_.empty());
  ASSERT_TRUE(level_files_.empty());
}